

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxCompareEq::Resolve(FxCompareEq *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  BYTE BVar2;
  PPointer *dest;
  PPointer *source;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  FxExpression *pFVar7;
  undefined4 extraout_var_01;
  FxTypeCast *pFVar8;
  FxExpression *pFVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  FxConstant *this_00;
  FxBoolCast *this_01;
  undefined4 extraout_var_05;
  char *pcVar10;
  char *pcVar11;
  undefined4 uVar12;
  PClass *pPVar13;
  PType *this_02;
  PType *pPVar14;
  undefined4 uVar15;
  ExpVal local_68;
  double local_58;
  double local_48;
  FString v1;
  FString v2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar9 = (this->super_FxBinary).left;
  if (pFVar9 != (FxExpression *)0x0) {
    iVar5 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar5);
  }
  pFVar9 = (this->super_FxBinary).right;
  if (pFVar9 == (FxExpression *)0x0) goto LAB_0050d888;
  ppFVar1 = &(this->super_FxBinary).right;
  iVar5 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,ctx);
  pFVar7 = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
  (this->super_FxBinary).right = pFVar7;
  pFVar9 = (this->super_FxBinary).left;
  if ((pFVar9 == (FxExpression *)0x0) || (pFVar7 == (FxExpression *)0x0)) goto LAB_0050d888;
  pPVar14 = pFVar9->ValueType;
  this_02 = pFVar7->ValueType;
  if (pPVar14 == this_02) {
    (this->super_FxBinary).super_FxExpression.ValueType = pPVar14;
LAB_0050d64b:
    if (((this->super_FxBinary).Operator != 0x121) ||
       (((this->super_FxBinary).super_FxExpression.ValueType)->RegType - 1 < 2)) {
      iVar5 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
      if (((char)iVar5 != '\0') &&
         (iVar5 = (*(*ppFVar1)->_vptr_FxExpression[3])(), (char)iVar5 != '\0')) {
        pPVar14 = (this->super_FxBinary).super_FxExpression.ValueType;
        if (pPVar14 == (PType *)TypeString) {
          ExpVal::ExpVal(&local_68,(ExpVal *)((this->super_FxBinary).left + 1));
          ExpVal::GetString((ExpVal *)&v1);
          ExpVal::~ExpVal(&local_68);
          ExpVal::ExpVal(&local_68,(ExpVal *)(*ppFVar1 + 1));
          ExpVal::GetString((ExpVal *)&v2);
          ExpVal::~ExpVal(&local_68);
          iVar5 = (this->super_FxBinary).Operator;
          if (iVar5 == 0x121) {
            iVar5 = strcasecmp(v1.Chars,v2.Chars);
            bVar4 = iVar5 == 0;
            pFVar9 = (FxExpression *)v2.Chars;
          }
          else {
            iVar6 = strcmp(v1.Chars,v2.Chars);
            bVar4 = (iVar5 == 0x11f) != (iVar6 != 0);
            pFVar9 = (FxExpression *)v2.Chars;
          }
          FString::~FString(&v2);
          FString::~FString(&v1);
        }
        else if (pPVar14->RegType == '\x01') {
          ExpVal::ExpVal(&local_68,(ExpVal *)((this->super_FxBinary).left + 1));
          local_58 = ExpVal::GetFloat(&local_68);
          ExpVal::~ExpVal(&local_68);
          pFVar9 = (this->super_FxBinary).right + 1;
          ExpVal::ExpVal(&local_68,(ExpVal *)pFVar9);
          local_48 = ExpVal::GetFloat(&local_68);
          ExpVal::~ExpVal(&local_68);
          iVar5 = (this->super_FxBinary).Operator;
          if (iVar5 == 0x120) {
            bVar4 = local_58 != local_48;
          }
          else {
            if (iVar5 != 0x11f) {
              bVar4 = ABS(local_58 - local_48) < 1.52587890625e-05;
              goto LAB_0050da6b;
            }
            bVar4 = local_58 == local_48;
          }
          bVar4 = (bool)(-bVar4 & 1);
        }
        else {
          ExpVal::ExpVal(&local_68,(ExpVal *)((this->super_FxBinary).left + 1));
          if ((local_68.Type)->RegType == '\x01') {
            uVar12 = (undefined4)(double)CONCAT44(local_68.field_1._4_4_,local_68.field_1.Int);
          }
          else {
            uVar12 = 0;
            if ((local_68.Type)->RegType == '\0') {
              uVar12 = local_68.field_1.Int;
            }
          }
          ExpVal::~ExpVal(&local_68);
          pFVar9 = *ppFVar1 + 1;
          ExpVal::ExpVal(&local_68,(ExpVal *)pFVar9);
          if ((local_68.Type)->RegType == '\x01') {
            uVar15 = (undefined4)(double)CONCAT44(local_68.field_1._4_4_,local_68.field_1.Int);
          }
          else {
            uVar15 = 0;
            if ((local_68.Type)->RegType == '\0') {
              uVar15 = local_68.field_1.Int;
            }
          }
          ExpVal::~ExpVal(&local_68);
          bVar4 = (uVar12 != uVar15) != ((this->super_FxBinary).Operator == 0x11f);
        }
LAB_0050da6b:
        this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar9);
        FxConstant::FxConstant
                  (this_00,(uint)bVar4,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
        (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
        return &this_00->super_FxExpression;
      }
      if ((this->super_FxBinary).Operator == 0x121) goto LAB_0050dbfc;
      iVar5 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
      if ((char)iVar5 != '\0') {
        pFVar9 = (this->super_FxBinary).left;
        BVar2 = pFVar9->ValueType->RegType;
        if (BVar2 == '\x03') {
          pFVar9 = pFVar9 + 1;
          ExpVal::ExpVal(&local_68,(ExpVal *)pFVar9);
          lVar3 = CONCAT44(local_68.field_1._4_4_,local_68.field_1.Int);
          BVar2 = (local_68.Type)->RegType;
          ExpVal::~ExpVal(&local_68);
          if ((BVar2 != '\x03') || (lVar3 == 0)) {
LAB_0050d956:
            if ((this->super_FxBinary).Operator == 0x11f) {
              this_01 = (FxBoolCast *)
                        FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar9);
              FxUnaryNotBoolean::FxUnaryNotBoolean((FxUnaryNotBoolean *)this_01,*ppFVar1);
            }
            else {
              this_01 = (FxBoolCast *)
                        FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar9);
              FxBoolCast::FxBoolCast(this_01,*ppFVar1,true);
            }
            (this->super_FxBinary).right = (FxExpression *)0x0;
            goto LAB_0050dbcd;
          }
        }
        else if (BVar2 == '\x01') {
          if (pFVar9->ValueType->RegCount != '\x01') {
            __assert_fail("left->ValueType->GetRegCount() == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0xd83,"virtual FxExpression *FxCompareEq::Resolve(FCompileContext &)");
          }
          pFVar9 = pFVar9 + 1;
          ExpVal::ExpVal(&local_68,(ExpVal *)pFVar9);
          local_58 = ExpVal::GetFloat(&local_68);
          ExpVal::~ExpVal(&local_68);
          if ((local_58 == 0.0) && (!NAN(local_58))) goto LAB_0050d956;
        }
        else if (BVar2 == '\0') {
          pFVar9 = pFVar9 + 1;
          ExpVal::ExpVal(&local_68,(ExpVal *)pFVar9);
          if ((local_68.Type)->RegType == '\x01') {
            uVar12 = (undefined4)(double)CONCAT44(local_68.field_1._4_4_,local_68.field_1.Int);
          }
          else {
            uVar12 = 0;
            if ((local_68.Type)->RegType == '\0') {
              uVar12 = local_68.field_1.Int;
            }
          }
          ExpVal::~ExpVal(&local_68);
          if (uVar12 == 0) goto LAB_0050d956;
        }
      }
      iVar5 = (*(*ppFVar1)->_vptr_FxExpression[3])();
      if ((char)iVar5 == '\0') goto LAB_0050dbfc;
      pFVar9 = *ppFVar1;
      BVar2 = pFVar9->ValueType->RegType;
      if (BVar2 == '\x03') {
        pFVar9 = pFVar9 + 1;
        ExpVal::ExpVal(&local_68,(ExpVal *)pFVar9);
        BVar2 = (local_68.Type)->RegType;
        ExpVal::~ExpVal(&local_68);
        if ((BVar2 == '\x03') && (CONCAT44(local_68.field_1._4_4_,local_68.field_1.Int) != 0))
        goto LAB_0050dbfc;
      }
      else if (BVar2 == '\x01') {
        if (pFVar9->ValueType->RegCount != '\x01') {
          __assert_fail("right->ValueType->GetRegCount() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0xda3,"virtual FxExpression *FxCompareEq::Resolve(FCompileContext &)");
        }
        pFVar9 = pFVar9 + 1;
        ExpVal::ExpVal(&local_68,(ExpVal *)pFVar9);
        local_58 = ExpVal::GetFloat(&local_68);
        ExpVal::~ExpVal(&local_68);
        if ((local_58 != 0.0) || (NAN(local_58))) goto LAB_0050dbfc;
      }
      else {
        if (BVar2 != '\0') {
LAB_0050dbfc:
          (this->super_FxBinary).super_FxExpression.ValueType = (PType *)TypeBool;
          return (FxExpression *)this;
        }
        pFVar9 = pFVar9 + 1;
        ExpVal::ExpVal(&local_68,(ExpVal *)pFVar9);
        if ((local_68.Type)->RegType == '\x01') {
          uVar12 = (undefined4)(double)CONCAT44(local_68.field_1._4_4_,local_68.field_1.Int);
        }
        else {
          uVar12 = 0;
          if ((local_68.Type)->RegType == '\0') {
            uVar12 = local_68.field_1.Int;
          }
        }
        ExpVal::~ExpVal(&local_68);
        if (uVar12 != 0) goto LAB_0050dbfc;
      }
      if ((this->super_FxBinary).Operator == 0x11f) {
        this_01 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar9);
        FxUnaryNotBoolean::FxUnaryNotBoolean
                  ((FxUnaryNotBoolean *)this_01,(this->super_FxBinary).left);
      }
      else {
        this_01 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar9);
        FxBoolCast::FxBoolCast(this_01,(this->super_FxBinary).left,true);
      }
      (this->super_FxBinary).left = (FxExpression *)0x0;
LAB_0050dbcd:
      (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
      iVar5 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
      return (FxExpression *)CONCAT44(extraout_var_05,iVar5);
    }
  }
  else {
    pPVar13 = (PClass *)
              CONCAT71((int7)((ulong)pPVar14 >> 8),
                       pPVar14 == (PType *)TypeName || pPVar14 == (PType *)TypeString);
    if (pPVar14 == (PType *)TypeName || pPVar14 == (PType *)TypeString) {
      if ((((this_02 != (PType *)TypeName) && (this_02 != (PType *)TypeSound)) &&
          (this_02 != (PType *)TypeColor)) &&
         ((pPVar13 = PClassPointer::RegistrationInfo.MyClass,
          bVar4 = DObject::IsKindOf((DObject *)this_02,PClassPointer::RegistrationInfo.MyClass),
          !bVar4 && (this_02 = (*ppFVar1)->ValueType, this_02 != (PType *)TypeStateLabel)))) {
        pFVar9 = (this->super_FxBinary).left;
        goto LAB_0050d436;
      }
      pFVar8 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar13);
      FxTypeCast::FxTypeCast
                (pFVar8,(this->super_FxBinary).left,((this->super_FxBinary).right)->ValueType,false,
                 true);
      (this->super_FxBinary).left = (FxExpression *)pFVar8;
      iVar5 = (*(pFVar8->super_FxExpression)._vptr_FxExpression[2])(pFVar8,ctx);
      (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var_01,iVar5);
      if ((FxExpression *)CONCAT44(extraout_var_01,iVar5) == (FxExpression *)0x0) goto LAB_0050d888;
      pFVar9 = (this->super_FxBinary).right;
LAB_0050d5f2:
      (this->super_FxBinary).super_FxExpression.ValueType = pFVar9->ValueType;
      goto LAB_0050d64b;
    }
LAB_0050d436:
    pPVar13 = (PClass *)
              CONCAT71((int7)((ulong)pPVar13 >> 8),
                       this_02 == (PType *)TypeName || this_02 == (PType *)TypeString);
    pPVar14 = pFVar9->ValueType;
    if ((this_02 == (PType *)TypeName || this_02 == (PType *)TypeString) &&
       (((pPVar14 == (PType *)TypeName || (pPVar14 == (PType *)TypeSound)) ||
        ((pPVar14 == (PType *)TypeColor ||
         ((pPVar13 = PClassPointer::RegistrationInfo.MyClass,
          bVar4 = DObject::IsKindOf((DObject *)pPVar14,PClassPointer::RegistrationInfo.MyClass),
          bVar4 || (pPVar14 = ((this->super_FxBinary).left)->ValueType,
                   pPVar14 == (PType *)TypeStateLabel)))))))) {
      pFVar8 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar13);
      FxTypeCast::FxTypeCast
                (pFVar8,(this->super_FxBinary).right,((this->super_FxBinary).left)->ValueType,false,
                 true);
      (this->super_FxBinary).right = (FxExpression *)pFVar8;
      iVar5 = (*(pFVar8->super_FxExpression)._vptr_FxExpression[2])(pFVar8,ctx);
      (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_03,iVar5);
      if ((FxExpression *)CONCAT44(extraout_var_03,iVar5) == (FxExpression *)0x0) goto LAB_0050d888;
      pFVar9 = (this->super_FxBinary).left;
      goto LAB_0050d5f2;
    }
    iVar5 = (*(pPVar14->super_PTypeBase).super_DObject._vptr_DObject[8])();
    if (((char)iVar5 != '\0') &&
       (iVar5 = (*((*ppFVar1)->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
       (char)iVar5 != '\0')) {
      FxBinary::Promote(&this->super_FxBinary,ctx,false);
      goto LAB_0050d64b;
    }
    dest = (PPointer *)((this->super_FxBinary).left)->ValueType;
    source = (PPointer *)((this->super_FxBinary).right)->ValueType;
    if (source == TypeNullPtr && dest == (PPointer *)TypeStateLabel) {
      pFVar8 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)source);
      FxTypeCast::FxTypeCast(pFVar8,*ppFVar1,(PType *)TypeStateLabel,false,false);
      *ppFVar1 = (FxExpression *)pFVar8;
      iVar5 = (*(pFVar8->super_FxExpression)._vptr_FxExpression[2])(pFVar8,ctx);
      pFVar9 = (FxExpression *)CONCAT44(extraout_var_02,iVar5);
      *ppFVar1 = pFVar9;
LAB_0050d642:
      if (pFVar9 == (FxExpression *)0x0) goto LAB_0050d888;
      goto LAB_0050d64b;
    }
    if (dest == TypeNullPtr && (PPointer *)TypeStateLabel == source) {
      pFVar8 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)source);
      FxTypeCast::FxTypeCast(pFVar8,(this->super_FxBinary).left,(PType *)TypeStateLabel,false,false)
      ;
      (this->super_FxBinary).left = (FxExpression *)pFVar8;
      iVar5 = (*(pFVar8->super_FxExpression)._vptr_FxExpression[2])(pFVar8,ctx);
      pFVar9 = (FxExpression *)CONCAT44(extraout_var_04,iVar5);
      (this->super_FxBinary).left = pFVar9;
      goto LAB_0050d642;
    }
    if ((((dest->super_PBasicType).super_PType.RegType == '\x03') &&
        ((source->super_PBasicType).super_PType.RegType == '\x03')) &&
       ((dest == source ||
        (((source == TypeNullPtr || (dest == TypeNullPtr)) ||
         (bVar4 = AreCompatiblePointerTypes((PType *)dest,(PType *)source,true), bVar4))))))
    goto LAB_0050d64b;
  }
  iVar5 = (this->super_FxBinary).Operator;
  pcVar11 = "~==";
  if (iVar5 == 0x120) {
    pcVar11 = "!=";
  }
  pcVar10 = "==";
  if (iVar5 != 0x11f) {
    pcVar10 = pcVar11;
  }
  FScriptPosition::Message
            (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
             "Incompatible operands for %s comparison",pcVar10);
LAB_0050d888:
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxCompareEq::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->ValueType != right->ValueType)	// identical types are always comparable, if they can be placed in a register, so we can save most checks if this is the case.
	{
		// Special cases: Compare strings and names with names, sounds, colors, state labels and class types.
		// These are all types a string can be implicitly cast into, so for convenience, so they should when doing a comparison.
		if ((left->ValueType == TypeString || left->ValueType == TypeName) &&
			(right->ValueType == TypeName || right->ValueType == TypeSound || right->ValueType == TypeColor || right->ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) || right->ValueType == TypeStateLabel))
		{
			left = new FxTypeCast(left, right->ValueType, false, true);
			left = left->Resolve(ctx);
			ABORT(left);
			ValueType = right->ValueType;
		}
		else if ((right->ValueType == TypeString || right->ValueType == TypeName) &&
			(left->ValueType == TypeName || left->ValueType == TypeSound || left->ValueType == TypeColor || left->ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) || left->ValueType == TypeStateLabel))
		{
			right = new FxTypeCast(right, left->ValueType, false, true);
			right = right->Resolve(ctx);
			ABORT(right);
			ValueType = left->ValueType;
		}
		else if (left->IsNumeric() && right->IsNumeric())
		{
			Promote(ctx);
		}
		// allows comparing state labels with null pointers.
		else if (left->ValueType == TypeStateLabel && right->ValueType == TypeNullPtr)
		{
			right = new FxTypeCast(right, TypeStateLabel, false);
			SAFE_RESOLVE(right, ctx);
		}
		else if (right->ValueType == TypeStateLabel && left->ValueType == TypeNullPtr)
		{
			left = new FxTypeCast(left, TypeStateLabel, false);
			SAFE_RESOLVE(left, ctx);
		}
		else if (left->ValueType->GetRegType() == REGT_POINTER && right->ValueType->GetRegType() == REGT_POINTER)
		{
			if (left->ValueType != right->ValueType && right->ValueType != TypeNullPtr && left->ValueType != TypeNullPtr &&
				!AreCompatiblePointerTypes(left->ValueType, right->ValueType, true))
			{
				goto error;
			}
		}
		else
		{
			goto error;
		}
	}
	else if (left->ValueType->GetRegType() == REGT_NIL)
	{
		goto error;
	}
	else
	{
		ValueType = left->ValueType;
	}

	if (Operator == TK_ApproxEq && ValueType->GetRegType() != REGT_FLOAT && ValueType->GetRegType() != REGT_STRING)
	{
		// Only floats, vectors and strings have handling for '~==', for all other types this is an error.
		goto error;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v;

		if (ValueType == TypeString)
		{
			FString v1 = static_cast<FxConstant *>(left)->GetValue().GetString();
			FString v2 = static_cast<FxConstant *>(right)->GetValue().GetString();
			if (Operator == TK_ApproxEq) v = !v1.CompareNoCase(v2);
			else
			{
				v = !!v1.Compare(v2);
				if (Operator == TK_Eq) v = !v;
			}
		}
		else if (ValueType->GetRegType() == REGT_FLOAT)
		{
			double v1 = static_cast<FxConstant *>(left)->GetValue().GetFloat();
			double v2 = static_cast<FxConstant *>(right)->GetValue().GetFloat();
			v = Operator == TK_Eq? v1 == v2 : Operator == TK_Neq? v1 != v2 : fabs(v1-v2) < VM_EPSILON;
		}
		else
		{
			int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
			int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();
			v = Operator == TK_Eq? v1 == v2 : v1 != v2;
		}
		FxExpression *e = new FxConstant(v, ScriptPosition);
		delete this;
		return e;
	}
	else
	{
		// also simplify comparisons against zero. For these a bool cast/unary not on the other value will do just as well and create better code.
		if (Operator != TK_ApproxEq)
		{
			if (left->isConstant())
			{
				bool leftisnull;
				switch (left->ValueType->GetRegType())
				{
				case REGT_INT:
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetInt() == 0;
					break;

				case REGT_FLOAT:
					assert(left->ValueType->GetRegCount() == 1);	// vectors should not be able to get here.
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetFloat() == 0;
					break;

				case REGT_POINTER:
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetPointer() == nullptr;
					break;

				default:
					leftisnull = false;
				}
				if (leftisnull)
				{
					FxExpression *x;
					if (Operator == TK_Eq) x = new FxUnaryNotBoolean(right);
					else x = new FxBoolCast(right);
					right = nullptr;
					delete this;
					return x->Resolve(ctx);
				}

			}
			if (right->isConstant())
			{
				bool rightisnull;
				switch (right->ValueType->GetRegType())
				{
				case REGT_INT:
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetInt() == 0;
					break;

				case REGT_FLOAT:
					assert(right->ValueType->GetRegCount() == 1);	// vectors should not be able to get here.
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetFloat() == 0;
					break;

				case REGT_POINTER:
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetPointer() == nullptr;
					break;

				default:
					rightisnull = false;
				}
				if (rightisnull)
				{
					FxExpression *x;
					if (Operator == TK_Eq) x = new FxUnaryNotBoolean(left);
					else x = new FxBoolCast(left);
					left = nullptr;
					delete this;
					return x->Resolve(ctx);
				}
			}
		}
	}
	ValueType = TypeBool;
	return this;

error:
	ScriptPosition.Message(MSG_ERROR, "Incompatible operands for %s comparison", Operator == TK_Eq ? "==" : Operator == TK_Neq ? "!=" : "~==");
	delete this;
	return nullptr;
}